

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# conc_heter_queue.h
# Opt level: O0

Msg * __thiscall
density::conc_heter_queue<density::runtime_type<>,density::basic_default_allocator<65536ul>>::
reentrant_consume_operation::
element<density_tests::conc_heterogeneous_queue_reentrant_put_transaction_samples()::Msg>
          (reentrant_consume_operation *this)

{
  Msg *pMVar1;
  reentrant_consume_operation *this_local;
  
  pMVar1 = heter_queue<density::runtime_type<>,density::basic_default_allocator<65536ul>>::
           reentrant_consume_operation::
           element<density_tests::conc_heterogeneous_queue_reentrant_put_transaction_samples()::Msg>
                     ((reentrant_consume_operation *)(this + 8));
  return pMVar1;
}

Assistant:

COMPLETE_ELEMENT_TYPE & element() const noexcept
            {
                return m_consume_operation.template element<COMPLETE_ELEMENT_TYPE>();
            }